

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clogger.h
# Opt level: O2

void __thiscall
CLogger::Info<char*&,char*&>(CLogger *this,string_view fmt,char **args,char **args_1)

{
  format_string_t<char_*&,_char_*&> fmt_00;
  logger *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  spdlog::get((char *)&local_38);
  fmt_00.str_.size_ = fmt._M_len;
  fmt_00.str_.data_ = fmt._M_str;
  spdlog::logger::info<char*&,char*&>(local_38,fmt_00,args,args_1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  return;
}

Assistant:

void Info(std::string_view fmt, Args &&...args)
	{
		spdlog::get("rs")->info(fmt, std::forward<Args>(args)...);
	}